

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_hotspot.cxx
# Opt level: O1

void __thiscall Fl_Window::hotspot(Fl_Window *this,Fl_Widget *o,int offscreen)

{
  int X;
  int Y;
  
  X = o->w_ / 2;
  Y = o->h_ / 2;
  if (o != (Fl_Widget *)0x0 && (Fl_Window *)o != this) {
    do {
      X = X + (((Fl_Window *)o)->super_Fl_Group).super_Fl_Widget.x_;
      Y = Y + (((Fl_Window *)o)->super_Fl_Group).super_Fl_Widget.y_;
      o = (Fl_Widget *)Fl_Widget::window(o);
      if ((Fl_Window *)o == this) break;
    } while ((Fl_Window *)o != (Fl_Window *)0x0);
  }
  hotspot(this,X,Y,offscreen);
  return;
}

Assistant:

void Fl_Window::hotspot(const Fl_Widget *o, int offscreen) {
  int X = o->w()/2;
  int Y = o->h()/2;
  while (o != this && o) {
    X += o->x(); Y += o->y();
    o = o->window();
  }
  hotspot(X,Y,offscreen);
}